

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormatLite::WriteSInt64ToArray
                    (int field_number,int64_t value,uint8_t *target)

{
  uint8_t *puVar1;
  uint8_t *target_local;
  int64_t value_local;
  int field_number_local;
  
  puVar1 = WriteTagToArray(field_number,WIRETYPE_VARINT,target);
  puVar1 = WriteSInt64NoTagToArray(value,puVar1);
  return puVar1;
}

Assistant:

inline uint8_t* WireFormatLite::WriteSInt64ToArray(int field_number,
                                                   int64_t value,
                                                   uint8_t* target) {
  target = WriteTagToArray(field_number, WIRETYPE_VARINT, target);
  return WriteSInt64NoTagToArray(value, target);
}